

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvrogencppTests.cc
# Opt level: O3

void checkRecord<testgen_r::RootRecord,testgen::RootRecord>(RootRecord *r1,RootRecord *r2)

{
  string *psVar1;
  int32_t *left_end;
  int32_t *right_end;
  size_t sVar2;
  double *pdVar3;
  void *pvVar4;
  _func_int **pp_Var5;
  undefined8 uVar6;
  RootRecord *pRVar7;
  int iVar8;
  double *pdVar9;
  double *pdVar10;
  readonly_property<bool> rVar11;
  RootRecord *local_198;
  RootRecord *local_190;
  assertion_result local_188;
  _func_int **local_170;
  undefined1 local_168 [8];
  undefined1 local_160 [8];
  _Base_ptr local_158;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_150;
  size_t local_140;
  undefined1 local_138 [8];
  element_type *local_130;
  shared_count sStack_128;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_120;
  size_t local_110;
  _Rb_tree_node_base local_108;
  undefined1 local_e8 [32];
  undefined1 local_c8 [16];
  RootRecord *local_b8;
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  _func_int **local_98;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x68;
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_108._0_8_ = &PTR__lazy_ostream_001c85f8;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_108._M_right = (_Base_ptr)0x1a1984;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(r1->mylong == r2->mylong);
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8._8_8_ = "";
  local_160[0] = false;
  local_130 = (element_type *)((ulong)local_130 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_001c8970;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_138 = (undefined1  [8])&PTR__lazy_ostream_001c8970;
  local_120._M_node = (_Base_ptr)&local_190;
  sStack_128.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_198 = r1;
  local_190 = r2;
  local_150._M_node = (_Base_ptr)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,(const_string *)local_e8,0x68,CHECK,CHECK_EQUAL,2
             ,"r1.mylong",local_168,"r2.mylong",local_138);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x69;
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_108._0_8_ = &PTR__lazy_ostream_001c85f8;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_108._M_right = (_Base_ptr)0x1a1984;
  local_198 = (RootRecord *)&(r1->nestedrecord).inval1;
  local_190 = (RootRecord *)&r2->nestedrecord;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((r1->nestedrecord).inval1 == (r2->nestedrecord).inval1);
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8._8_8_ = "";
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_001c86f8;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_130 = (element_type *)((ulong)local_130 & 0xffffffffffffff00);
  local_98 = (_func_int **)&PTR__lazy_ostream_001c86f8;
  local_138 = (undefined1  [8])&PTR__lazy_ostream_001c86f8;
  sStack_128.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_120._M_node = (_Base_ptr)&local_190;
  local_150._M_node = (_Base_ptr)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,(const_string *)local_e8,0x69,CHECK,CHECK_EQUAL,2
             ,"r1.nestedrecord.inval1",local_168,"r2.nestedrecord.inval1",local_138);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  rVar11.super_class_property<bool>.value = (class_property<bool>)false;
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x6a;
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_170 = (_func_int **)&PTR__lazy_ostream_001c85f8;
  local_108._0_8_ = &PTR__lazy_ostream_001c85f8;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_108._M_right = (_Base_ptr)0x1a1984;
  psVar1 = &(r2->nestedrecord).inval2;
  sVar2 = (r1->nestedrecord).inval2._M_string_length;
  if (sVar2 == (r2->nestedrecord).inval2._M_string_length) {
    if (sVar2 == 0) {
      rVar11.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar8 = bcmp((r1->nestedrecord).inval2._M_dataplus._M_p,(psVar1->_M_dataplus)._M_p,sVar2);
      rVar11.super_class_property<bool>.value = (class_property<bool>)(iVar8 == 0);
    }
  }
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8._8_8_ = "";
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_001c8638;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_130 = (element_type *)((ulong)local_130 & 0xffffffffffffff00);
  local_a0 = (_Base_ptr)&PTR__lazy_ostream_001c8638;
  local_138 = (undefined1  [8])&PTR__lazy_ostream_001c8638;
  sStack_128.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_120._M_node = (_Base_ptr)&local_190;
  local_198 = (RootRecord *)&r1->nestedrecord;
  local_190 = (RootRecord *)psVar1;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar11.super_class_property<bool>.value;
  local_150._M_node = (_Base_ptr)&local_198;
  local_b8 = r2;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,(const_string *)local_e8,0x6a,CHECK,CHECK_EQUAL,2
             ,"r1.nestedrecord.inval2",local_168,"r2.nestedrecord.inval2",local_138);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  pRVar7 = local_b8;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x6b;
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_108._0_8_ = local_170;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_108._M_right = (_Base_ptr)0x1a1984;
  local_198 = (RootRecord *)&(r1->nestedrecord).inval3;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((r1->nestedrecord).inval3 == (local_b8->nestedrecord).inval3);
  local_190 = (RootRecord *)&(local_b8->nestedrecord).inval3;
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8._8_8_ = "";
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_001c86b8;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_130 = (element_type *)((ulong)local_130 & 0xffffffffffffff00);
  local_b0 = (_Base_ptr)&PTR__lazy_ostream_001c86b8;
  local_138 = (undefined1  [8])&PTR__lazy_ostream_001c86b8;
  sStack_128.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_120._M_node = (_Base_ptr)&local_190;
  local_150._M_node = (_Base_ptr)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,(const_string *)local_e8,0x6b,CHECK,CHECK_EQUAL,2
             ,"r1.nestedrecord.inval3",local_168,"r2.nestedrecord.inval3",local_138);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  rVar11.super_class_property<bool>.value = (class_property<bool>)false;
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x6c;
  local_e8._16_8_ = r1;
  if ((r1->mymap)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (pRVar7->mymap)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    rVar11.super_class_property<bool>.value =
         (class_property<bool>)
         std::__equal<false>::
         equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,int>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,int>>>
                   ((r1->mymap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                    (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                     )&(r1->mymap)._M_t._M_impl.super__Rb_tree_header,
                    (pRVar7->mymap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  local_130 = (element_type *)0x0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_108._0_8_ = "r1.mymap == r2.mymap";
  local_108._M_parent = (_Base_ptr)0x1a5aca;
  local_160[0] = false;
  local_c8._8_8_ = &PTR__lazy_ostream_001c89b0;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_001c89b0;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_40.m_end = "";
  local_150._M_node = &local_108;
  local_138[0] = rVar11.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_138,(lazy_ostream *)local_168,&local_40,0x6c,CHECK,CHECK_PRED
             ,0);
  boost::detail::shared_count::~shared_count(&sStack_128);
  boost::unit_test::anon_unknown_0::s_log_impl();
  rVar11.super_class_property<bool>.value = (class_property<bool>)false;
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x6d;
  pdVar9 = (((vector<double,_std::allocator<double>_> *)(local_e8._16_8_ + 0xe8))->
           super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (((vector<double,_std::allocator<double>_> *)(local_e8._16_8_ + 0xe8))->
           super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar10 = (pRVar7->myarray).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar3 - (long)pdVar9 ==
      (long)(pRVar7->myarray).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar10) {
    rVar11.super_class_property<bool>.value = (class_property<bool>)true;
    for (; pdVar9 != pdVar3; pdVar9 = pdVar9 + 1) {
      if ((*pdVar9 != *pdVar10) || (NAN(*pdVar9) || NAN(*pdVar10))) {
        rVar11.super_class_property<bool>.value = (class_property<bool>)false;
        break;
      }
      pdVar10 = pdVar10 + 1;
    }
  }
  local_138[0] = rVar11.super_class_property<bool>.value;
  local_130 = (element_type *)0x0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_108._0_8_ = "r1.myarray == r2.myarray";
  local_108._M_parent = (_Base_ptr)0x1a5ae3;
  local_160[0] = false;
  local_168 = (undefined1  [8])local_c8._8_8_;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_50.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_50.m_end = "";
  local_150._M_node = &local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_138,(lazy_ostream *)local_168,&local_50,0x6d,CHECK,CHECK_PRED
             ,0);
  boost::detail::shared_count::~shared_count(&sStack_128);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  pRVar7 = local_b8;
  uVar6 = local_e8._16_8_;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x6e;
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_108._0_8_ = local_170;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_108._M_right = (_Base_ptr)0x1a1984;
  local_c8._0_8_ = ((_bigrecord_r_Union__2__ *)(local_e8._16_8_ + 0x108))->idx_;
  local_198 = (RootRecord *)local_c8;
  local_e8._24_8_ = (local_b8->myunion).idx_;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_c8._0_8_ == local_e8._24_8_);
  local_190 = (RootRecord *)(local_e8 + 0x18);
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160[0] = false;
  local_130 = (element_type *)((ulong)local_130 & 0xffffffffffffff00);
  local_138 = (undefined1  [8])&PTR__lazy_ostream_001c89f0;
  sStack_128.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_120._M_node = (_Base_ptr)&local_190;
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8._8_8_ = "";
  local_a8 = (_Base_ptr)&PTR__lazy_ostream_001c89f0;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_001c89f0;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_150._M_node = (_Base_ptr)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,(const_string *)local_e8,0x6e,CHECK,CHECK_EQUAL,2
             ,"r1.myunion.idx()",(lazy_ostream *)local_168,"r2.myunion.idx()",local_138);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x6f;
  testgen_r::_bigrecord_r_Union__2__::get_map_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_168,(_bigrecord_r_Union__2__ *)(uVar6 + 0x108));
  testgen::_bigrecord_Union__0__::get_map_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_138,&pRVar7->myunion);
  if (local_140 == local_110) {
    local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         std::__equal<false>::
         equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,int>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,int>>>
                   (local_150,(_Base_ptr)local_160,local_120);
  }
  else {
    local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8._0_8_ = "r1.myunion.get_map() == r2.myunion.get_map()";
  local_e8._8_8_ = "";
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_108._0_8_ = local_c8._8_8_;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_60.m_end = "";
  local_108._M_right = (_Base_ptr)local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,&local_60,0x6f,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_168);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  pRVar7 = local_b8;
  uVar6 = local_e8._16_8_;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x70;
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_108._0_8_ = local_170;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_108._M_right = (_Base_ptr)0x1a1984;
  local_c8._0_8_ = ((_bigrecord_r_Union__3__ *)(local_e8._16_8_ + 0x118))->idx_;
  local_e8._24_8_ = (local_b8->anotherunion).idx_;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_c8._0_8_ == local_e8._24_8_);
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160[0] = false;
  local_130 = (element_type *)((ulong)local_130 & 0xffffffffffffff00);
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8._8_8_ = "";
  local_198 = (RootRecord *)local_c8;
  local_168 = (undefined1  [8])local_a8;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_190 = (RootRecord *)(local_e8 + 0x18);
  local_138 = (undefined1  [8])local_a8;
  sStack_128.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_120._M_node = (_Base_ptr)&local_190;
  local_150._M_node = (_Base_ptr)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,(const_string *)local_e8,0x70,CHECK,CHECK_EQUAL,2
             ,"r1.anotherunion.idx()",
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_168,"r2.anotherunion.idx()",
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_138);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x71;
  testgen_r::_bigrecord_r_Union__3__::get_bytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,
             (_bigrecord_r_Union__3__ *)(uVar6 + 0x118));
  testgen::_bigrecord_Union__1__::get_bytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,
             &pRVar7->anotherunion);
  if ((long)local_108._M_parent - local_108._0_8_ ==
      (long)local_188.m_message.px -
      (long)CONCAT71(local_188._1_7_,
                     local_188.p_predicate_value.super_readonly_property<bool>.
                     super_class_property<bool>.value)) {
    if (local_108._M_parent == (_Base_ptr)local_108._0_8_) {
      rVar11.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar8 = bcmp((void *)local_108._0_8_,
                   (void *)CONCAT71(local_188._1_7_,
                                    local_188.p_predicate_value.super_readonly_property<bool>.
                                    super_class_property<bool>.value),
                   (long)local_108._M_parent - local_108._0_8_);
      rVar11.super_class_property<bool>.value = (class_property<bool>)(iVar8 == 0);
    }
  }
  else {
    rVar11.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_138[0] = rVar11.super_class_property<bool>.value;
  local_130 = (element_type *)0x0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_e8._0_8_ = "r1.anotherunion.get_bytes() == r2.anotherunion.get_bytes()";
  local_e8._8_8_ = "";
  local_160[0] = false;
  local_168 = (undefined1  [8])local_c8._8_8_;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_70.m_end = "";
  local_150._M_node = (_Base_ptr)local_e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_138,(lazy_ostream *)local_168,&local_70,0x71,CHECK,CHECK_PRED
             ,0);
  boost::detail::shared_count::~shared_count(&sStack_128);
  pp_Var5 = local_170;
  pvVar4 = (void *)CONCAT71(local_188._1_7_,
                            local_188.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_188.m_message.pn.pi_ - (long)pvVar4);
  }
  if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_108._0_8_,(long)local_108._M_left - local_108._0_8_);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x72;
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_108._0_8_ = pp_Var5;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_108._M_right = (_Base_ptr)0x1a1984;
  local_198 = (RootRecord *)(uVar6 + 0x128);
  local_190 = (RootRecord *)&pRVar7->mybool;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*(bool *)(uVar6 + 0x128) == pRVar7->mybool);
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8._8_8_ = "";
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_001c8a30;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_130 = (element_type *)((ulong)local_130 & 0xffffffffffffff00);
  local_138 = (undefined1  [8])&PTR__lazy_ostream_001c8a30;
  sStack_128.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_120._M_node = (_Base_ptr)&local_190;
  local_150._M_node = (_Base_ptr)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,(const_string *)local_e8,0x72,CHECK,CHECK_EQUAL,2
             ,"r1.mybool",local_168,"r2.mybool",local_138);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x73;
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_108._0_8_ = pp_Var5;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_108._M_right = (_Base_ptr)0x1a1984;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (((Nested *)(uVar6 + 0x130))->inval1 == (pRVar7->anothernested).inval1);
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_198 = (RootRecord *)&((Nested *)(uVar6 + 0x130))->inval1;
  local_190 = (RootRecord *)&pRVar7->anothernested;
  local_160[0] = false;
  local_130 = (element_type *)((ulong)local_130 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])local_98;
  local_138 = (undefined1  [8])local_98;
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8._8_8_ = "";
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  sStack_128.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_120._M_node = (_Base_ptr)&local_190;
  local_150._M_node = (_Base_ptr)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,(const_string *)local_e8,0x73,CHECK,CHECK_EQUAL,2
             ,"r1.anothernested.inval1",local_168,"r2.anothernested.inval1",local_138);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  rVar11.super_class_property<bool>.value = (class_property<bool>)false;
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x74;
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_108._0_8_ = pp_Var5;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_108._M_right = (_Base_ptr)0x1a1984;
  psVar1 = &(pRVar7->anothernested).inval2;
  sVar2 = (((Nested *)(uVar6 + 0x130))->inval2)._M_string_length;
  if (sVar2 == (pRVar7->anothernested).inval2._M_string_length) {
    if (sVar2 == 0) {
      rVar11.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar8 = bcmp((((Nested *)(uVar6 + 0x130))->inval2)._M_dataplus._M_p,(psVar1->_M_dataplus)._M_p
                   ,sVar2);
      rVar11.super_class_property<bool>.value = (class_property<bool>)(iVar8 == 0);
    }
  }
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8._8_8_ = "";
  local_160[0] = false;
  local_168 = (undefined1  [8])local_a0;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_130 = (element_type *)((ulong)local_130 & 0xffffffffffffff00);
  local_138 = (undefined1  [8])local_a0;
  sStack_128.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_198 = (RootRecord *)(uVar6 + 0x130);
  local_190 = (RootRecord *)psVar1;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar11.super_class_property<bool>.value;
  local_150._M_node = (_Base_ptr)&local_198;
  local_120._M_node = (_Base_ptr)&local_190;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,(const_string *)local_e8,0x74,CHECK,CHECK_EQUAL,2
             ,"r1.anothernested.inval2",local_168,"r2.anothernested.inval2",local_138);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x75;
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_108._0_8_ = local_170;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_108._M_right = (_Base_ptr)0x1a1984;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (((Nested *)(uVar6 + 0x130))->inval3 == (pRVar7->anothernested).inval3);
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_198 = (RootRecord *)&((Nested *)(uVar6 + 0x130))->inval3;
  local_190 = (RootRecord *)&(pRVar7->anothernested).inval3;
  local_160[0] = false;
  local_130 = (element_type *)((ulong)local_130 & 0xffffffffffffff00);
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8._8_8_ = "";
  local_168 = (undefined1  [8])local_b0;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_138 = (undefined1  [8])local_b0;
  sStack_128.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_150._M_node = (_Base_ptr)&local_198;
  local_120._M_node = (_Base_ptr)&local_190;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,(const_string *)local_e8,0x75,CHECK,CHECK_EQUAL,2
             ,"r1.anothernested.inval3",local_168,"r2.anothernested.inval3",local_138);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x77;
  left_end = (int32_t *)(uVar6 + 0x1a0);
  right_end = &pRVar7->anotherint;
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_138,(equal_coll_impl *)&local_108,(uchar *)(uVar6 + 400),
             (uchar *)left_end,(pRVar7->myfixed).elems,(uchar *)right_end);
  local_160[0] = false;
  local_168 = (undefined1  [8])local_170;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_150._M_node = (_Base_ptr)0x1a1984;
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_80.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_138,(lazy_ostream *)local_168,&local_80,0x77,CHECK,
             CHECK_EQUAL_COLL,4,"r1.myfixed.begin()","r1.myfixed.end()","r2.myfixed.begin()",
             "r2.myfixed.end()");
  boost::detail::shared_count::~shared_count(&sStack_128);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x78;
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_108._0_8_ = local_170;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_108._M_right = (_Base_ptr)0x1a1984;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*left_end == *right_end);
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8._8_8_ = "";
  local_160[0] = false;
  local_168 = (undefined1  [8])local_b0;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_130 = (element_type *)((ulong)local_130 & 0xffffffffffffff00);
  local_138 = (undefined1  [8])local_b0;
  sStack_128.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_120._M_node = (_Base_ptr)&local_190;
  local_198 = (RootRecord *)left_end;
  local_190 = (RootRecord *)right_end;
  local_150._M_node = (_Base_ptr)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,(const_string *)local_e8,0x78,CHECK,CHECK_EQUAL,2
             ,"r1.anotherint",local_168,"r2.anotherint",local_138);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  uVar6 = local_e8._16_8_;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x79;
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_108._0_8_ = local_170;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_108._M_right = (_Base_ptr)0x1a1984;
  local_c8._0_8_ =
       (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_e8._16_8_ + 0x1a8))->
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish +
       -(long)(((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_e8._16_8_ + 0x1a8))
              ->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_e8._24_8_ =
       (pRVar7->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish +
       -(long)(pRVar7->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_c8._0_8_ == local_e8._24_8_);
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_198 = (RootRecord *)local_c8;
  local_190 = (RootRecord *)(local_e8 + 0x18);
  local_160[0] = false;
  local_130 = (element_type *)((ulong)local_130 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])local_a8;
  local_138 = (undefined1  [8])local_a8;
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8._8_8_ = "";
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  sStack_128.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_120._M_node = (_Base_ptr)&local_190;
  local_150._M_node = (_Base_ptr)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,(const_string *)local_e8,0x79,CHECK,CHECK_EQUAL,2
             ,"r1.bytes.size()",local_168,"r2.bytes.size()",local_138);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x7b;
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_138,(equal_coll_impl *)&local_108,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(uVar6 + 0x1a8))->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(uVar6 + 0x1a8))->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(pRVar7->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(pRVar7->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  local_160[0] = false;
  local_168 = (undefined1  [8])local_170;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_150._M_node = (_Base_ptr)0x1a1984;
  local_90.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_90.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_138,(lazy_ostream *)local_168,&local_90,0x7b,CHECK,
             CHECK_EQUAL_COLL,4,"r1.bytes.begin()","r1.bytes.end()","r2.bytes.begin()",
             "r2.bytes.end()");
  boost::detail::shared_count::~shared_count(&sStack_128);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1cb880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a7f97);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x7c;
  local_108._M_parent = (_Base_ptr)((ulong)local_108._M_parent & 0xffffffffffffff00);
  local_108._0_8_ = local_170;
  local_108._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_108._M_right = (_Base_ptr)0x1a1984;
  local_198 = (RootRecord *)(uVar6 + 0x100);
  local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*(ExampleEnum *)(uVar6 + 0x100) == pRVar7->myenum);
  local_190 = (RootRecord *)&pRVar7->myenum;
  local_188.m_message.px = (element_type *)0x0;
  local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
  ;
  local_e8._8_8_ = "";
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_001c8af8;
  local_158 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_130 = (element_type *)((ulong)local_130 & 0xffffffffffffff00);
  local_138 = (undefined1  [8])&PTR__lazy_ostream_001c8a70;
  sStack_128.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_120._M_node = (_Base_ptr)&local_190;
  local_150._M_node = (_Base_ptr)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,(lazy_ostream *)&local_108,(const_string *)local_e8,0x7c,CHECK,CHECK_EQUAL,2
             ,"r1.myenum",(lazy_ostream *)local_168,"r2.myenum",local_138);
  boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
  return;
}

Assistant:

void checkRecord(const T1& r1, const T2& r2)
{
    BOOST_CHECK_EQUAL(r1.mylong, r2.mylong);
    BOOST_CHECK_EQUAL(r1.nestedrecord.inval1, r2.nestedrecord.inval1);
    BOOST_CHECK_EQUAL(r1.nestedrecord.inval2, r2.nestedrecord.inval2);
    BOOST_CHECK_EQUAL(r1.nestedrecord.inval3, r2.nestedrecord.inval3);
    BOOST_CHECK(r1.mymap == r2.mymap);
    BOOST_CHECK(r1.myarray == r2.myarray);
    BOOST_CHECK_EQUAL(r1.myunion.idx(), r2.myunion.idx());
    BOOST_CHECK(r1.myunion.get_map() == r2.myunion.get_map());
    BOOST_CHECK_EQUAL(r1.anotherunion.idx(), r2.anotherunion.idx());
    BOOST_CHECK(r1.anotherunion.get_bytes() == r2.anotherunion.get_bytes());
    BOOST_CHECK_EQUAL(r1.mybool, r2.mybool);
    BOOST_CHECK_EQUAL(r1.anothernested.inval1, r2.anothernested.inval1);
    BOOST_CHECK_EQUAL(r1.anothernested.inval2, r2.anothernested.inval2);
    BOOST_CHECK_EQUAL(r1.anothernested.inval3, r2.anothernested.inval3);
    BOOST_CHECK_EQUAL_COLLECTIONS(r1.myfixed.begin(), r1.myfixed.end(),
        r2.myfixed.begin(), r2.myfixed.end());
    BOOST_CHECK_EQUAL(r1.anotherint, r2.anotherint);
    BOOST_CHECK_EQUAL(r1.bytes.size(), r2.bytes.size());
    BOOST_CHECK_EQUAL_COLLECTIONS(r1.bytes.begin(), r1.bytes.end(),
        r2.bytes.begin(), r2.bytes.end());
    BOOST_CHECK_EQUAL(r1.myenum, r2.myenum);
}